

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O3

void configuration_object_destroy(configuration config)

{
  if (config->name != (char *)0x0) {
    free(config->name);
  }
  if (config->path != (char *)0x0) {
    free(config->path);
  }
  if (config->source != (char *)0x0) {
    free(config->source);
  }
  set_destroy(config->map);
  if (config->v != (value)0x0) {
    value_type_destroy(config->v);
  }
  free(config);
  return;
}

Assistant:

void configuration_object_destroy(configuration config)
{
	if (config->name != NULL)
	{
		free(config->name);
	}

	if (config->path != NULL)
	{
		free(config->path);
	}

	if (config->source != NULL)
	{
		free(config->source);
	}

	set_destroy(config->map);

	if (config->v != NULL)
	{
		value_type_destroy(config->v);
	}

	free(config);
}